

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O2

void bssl::dtls_clear_unused_write_epochs(SSL *ssl)

{
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *this;
  byte bVar1;
  bool bVar2;
  long lVar3;
  unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *write_epoch;
  __uniq_ptr_impl<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *__u;
  __uniq_ptr_impl<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *this_00;
  ulong uVar4;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *write_epoch_00
  ;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *write_epoch_01
  ;
  size_t new_size;
  size_t i;
  anon_class_8_1_ba1d796c_for__M_pred local_68;
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *local_60;
  long local_58;
  ulong local_50;
  char *local_48;
  DTLS1_STATE *local_40;
  anon_class_8_1_ba1d796c_for__M_pred local_38;
  
  local_40 = ssl->d1;
  this = &local_40->extra_write_epochs;
  bVar1 = (local_40->extra_write_epochs).size_;
  local_50 = (ulong)((uint)bVar1 * 8);
  local_48 = (local_40->extra_write_epochs).storage_ + local_50;
  local_58 = (ulong)(bVar1 >> 2) * 0x20;
  local_60 = (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
             ((long)&local_40->extra_write_epochs + local_58);
  write_epoch_00 = this;
  local_68.ssl = ssl;
  local_38.ssl = ssl;
  for (uVar4 = (ulong)(bVar1 >> 2); write_epoch_01 = local_60, 0 < (long)uVar4; uVar4 = uVar4 - 1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc:532:7)>
            ::anon_class_8_1_ba1d796c_for__M_pred::operator()
                      (&local_68,(UniquePtr<DTLSWriteEpoch> *)write_epoch_00);
    write_epoch_01 = write_epoch_00;
    if (bVar2) goto LAB_0016547e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc:532:7)>
            ::anon_class_8_1_ba1d796c_for__M_pred::operator()
                      (&local_68,(UniquePtr<DTLSWriteEpoch> *)(write_epoch_00->storage_ + 8));
    write_epoch_01 =
         (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
         (write_epoch_00->storage_ + 8);
    if (bVar2) goto LAB_0016547e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc:532:7)>
            ::anon_class_8_1_ba1d796c_for__M_pred::operator()
                      (&local_68,(UniquePtr<DTLSWriteEpoch> *)&write_epoch_00->size_);
    write_epoch_01 =
         (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
         &write_epoch_00->size_;
    if (bVar2) goto LAB_0016547e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc:532:7)>
            ::anon_class_8_1_ba1d796c_for__M_pred::operator()
                      (&local_68,(UniquePtr<DTLSWriteEpoch> *)(write_epoch_00 + 1));
    write_epoch_01 = write_epoch_00 + 1;
    if (bVar2) goto LAB_0016547e;
    write_epoch_00 =
         (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
         ((UniquePtr<DTLSIncomingMessage> *)(write_epoch_00 + 1) + 1);
  }
  lVar3 = (long)(local_50 - local_58) >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      if (lVar3 != 3) {
        return;
      }
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc:532:7)>
              ::anon_class_8_1_ba1d796c_for__M_pred::operator()
                        (&local_68,(UniquePtr<DTLSWriteEpoch> *)local_60);
      if (bVar2) goto LAB_0016547e;
      write_epoch_01 =
           (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
           (write_epoch_01->storage_ + 8);
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc:532:7)>
            ::anon_class_8_1_ba1d796c_for__M_pred::operator()
                      (&local_68,(UniquePtr<DTLSWriteEpoch> *)write_epoch_01);
    if (bVar2) goto LAB_0016547e;
    write_epoch_01 =
         (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)
         (write_epoch_01->storage_ + 8);
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc:532:7)>
          ::anon_class_8_1_ba1d796c_for__M_pred::operator()
                    (&local_68,(UniquePtr<DTLSWriteEpoch> *)write_epoch_01);
  if (!bVar2) {
    return;
  }
LAB_0016547e:
  if (write_epoch_01 ==
      (InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL> *)local_48
     ) {
    return;
  }
  new_size = (long)write_epoch_01 - (long)this >> 3;
  i = new_size;
  while (i = i + 1, i < bVar1) {
    write_epoch = InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>
                  ::operator[](this,i);
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc:532:7)>
            ::anon_class_8_1_ba1d796c_for__M_pred::operator()(&local_38,write_epoch);
    if (!bVar2) {
      __u = (__uniq_ptr_impl<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)
            InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::
            operator[](this,i);
      this_00 = (__uniq_ptr_impl<bssl::DTLSWriteEpoch,_bssl::internal::Deleter> *)
                InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::
                operator[](this,new_size);
      std::__uniq_ptr_impl<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>::operator=(this_00,__u);
      new_size = new_size + 1;
    }
    bVar1 = (local_40->extra_write_epochs).size_;
  }
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,_bssl::internal::Deleter>,_2UL>::Shrink
            (this,new_size);
  return;
}

Assistant:

void dtls_clear_unused_write_epochs(SSL *ssl) {
  ssl->d1->extra_write_epochs.EraseIf(
      [ssl](const UniquePtr<DTLSWriteEpoch> &write_epoch) -> bool {
        // Non-current epochs may be discarded once there are no incomplete
        // outgoing messages that reference them.
        //
        // TODO(crbug.com/42290594): Epoch 1 (0-RTT) should be retained until
        // epoch 3 (app data) is available.
        for (const auto &msg : ssl->d1->outgoing_messages) {
          if (msg.epoch == write_epoch->epoch() && !msg.IsFullyAcked()) {
            return false;
          }
        }
        return true;
      });
}